

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O3

bool __thiscall
Assimp::AMFImporter::Find_ConvertedMaterial
          (AMFImporter *this,string *pID,SPP_Material **pConvertedMaterial)

{
  pointer __s2;
  _List_node_base *__n;
  int iVar1;
  _List_node_base *p_Var2;
  
  p_Var2 = (this->mMaterial_Converted).
           super__List_base<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)&this->mMaterial_Converted) {
    __s2 = (pID->_M_dataplus)._M_p;
    __n = (_List_node_base *)pID->_M_string_length;
    do {
      if ((p_Var2[1]._M_prev == __n) &&
         ((__n == (_List_node_base *)0x0 ||
          (iVar1 = bcmp((((SPP_Material *)(p_Var2 + 1))->ID)._M_dataplus._M_p,__s2,(size_t)__n),
          iVar1 == 0)))) {
        if (pConvertedMaterial == (SPP_Material **)0x0) {
          return true;
        }
        *pConvertedMaterial = (SPP_Material *)(p_Var2 + 1);
        return true;
      }
      p_Var2 = p_Var2->_M_next;
    } while (p_Var2 != (_List_node_base *)&this->mMaterial_Converted);
  }
  return false;
}

Assistant:

bool AMFImporter::Find_ConvertedMaterial(const std::string& pID, const SPP_Material** pConvertedMaterial) const
{
	for(const SPP_Material& mat: mMaterial_Converted)
	{
		if(mat.ID == pID)
		{
			if(pConvertedMaterial != nullptr) *pConvertedMaterial = &mat;

			return true;
		}
	}// for(const SPP_Material& mat: mMaterial_Converted)

	return false;
}